

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdEmuEmuD3D0TlvFogTri::~MthdEmuEmuD3D0TlvFogTri(MthdEmuEmuD3D0TlvFogTri *this)

{
  MthdEmuEmuD3D0TlvFogTri *this_local;
  
  ~MthdEmuEmuD3D0TlvFogTri(this);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			exp.celsius_pipe_vtx[8] = pgraph_idx_ubyte_to_float(extr(val, 16, 8));
			exp.celsius_pipe_vtx[9] = pgraph_idx_ubyte_to_float(extr(val, 8, 8));
			exp.celsius_pipe_vtx[10] = pgraph_idx_ubyte_to_float(extr(val, 0, 8));
			exp.celsius_pipe_vtx[11] = pgraph_idx_ubyte_to_float(extr(val, 24, 8));
		}
		exp.misc24[2] = val & 0xffffff;
		insrt(exp.valid[1], 0, 7, 1);
	}